

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::analysis::Matrix::str_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  ostream *poVar1;
  ostringstream oss;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"<");
  (*this->element_type_->_vptr_Type[3])(local_1c0);
  poVar1 = std::operator<<(poVar1,local_1c0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,">");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::str() const {
  std::ostringstream oss;
  oss << "<" << element_type_->str() << ", " << count_ << ">";
  return oss.str();
}